

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],
          Array<kj::StringTree> *params_1,char (*params_2) [2])

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringPtr delim;
  StringTree local_80;
  Array<kj::StringTree> *local_48;
  char *local_40;
  kj *local_38;
  ArrayDisposer *local_30;
  
  local_30 = (ArrayDisposer *)strlen((char *)this);
  delim.content.size_ = 1;
  delim.content.ptr = "";
  local_38 = this;
  StringTree::StringTree(&local_80,(Array<kj::StringTree> *)params,delim);
  local_40 = (char *)strlen((char *)params_1);
  local_48 = params_1;
  StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,(ArrayPtr<const_char> *)&local_80,
             (StringTree *)&local_48,(ArrayPtr<const_char> *)params_2);
  sVar2 = local_80.branches.size_;
  pBVar3 = local_80.branches.ptr;
  if (local_80.branches.ptr != (Branch *)0x0) {
    local_80.branches.ptr = (Branch *)0x0;
    local_80.branches.size_ = 0;
    (**(local_80.branches.disposer)->_vptr_ArrayDisposer)
              (local_80.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_80.text.content.size_;
  pcVar1 = local_80.text.content.ptr;
  if (local_80.text.content.ptr != (char *)0x0) {
    local_80.text.content.ptr = (char *)0x0;
    local_80.text.content.size_ = 0;
    (**(local_80.text.content.disposer)->_vptr_ArrayDisposer)
              (local_80.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}